

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

void google::protobuf::internal::arena_destruct_object<google::protobuf::RepeatedField<bool>>
               (void *object)

{
  RepeatedField<bool>::InternalDeallocate
            ((RepeatedField<bool> *)object,*(Rep **)((long)object + 8),*(int *)((long)object + 4));
  return;
}

Assistant:

void arena_delete_object(void* object) {
  delete reinterpret_cast<T*>(object);
}